

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::compute_order::
init<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
          (compute_order *this,
          solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
          *s,bit_array *x)

{
  constraint_order cVar1;
  iterator __first;
  iterator __last;
  bit_array *x_local;
  solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  *s_local;
  compute_order *this_local;
  
  cVar1 = this->order;
  if (random_sorting < cVar1) {
    if (cVar1 - infeasibility_decr < 2) {
      infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>const,baryonyx::bit_array>
                (this,s,x);
      return;
    }
    if ((1 < cVar1 - lagrangian_decr) && (cVar1 == pi_sign_change)) {
      __first = std::vector<int,_std::allocator<int>_>::begin(&this->R);
      __last = std::vector<int,_std::allocator<int>_>::end(&this->R);
      std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __first._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __last._M_current,0);
      return;
    }
  }
  compute_violated_constraints<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
            (s,x,&this->R);
  return;
}

Assistant:

void init(const Solver& s, const Xtype& x)
    {
        switch (order) {
        case solver_parameters::constraint_order::infeasibility_decr:
        case solver_parameters::constraint_order::infeasibility_incr:
            infeasibility_local_compute_violated_constraints(s, x);
            break;
        case solver_parameters::constraint_order::pi_sign_change:
            std::iota(R.begin(), R.end(), 0);
            break;
        case solver_parameters::constraint_order::none:
        case solver_parameters::constraint_order::reversing:
        case solver_parameters::constraint_order::random_sorting:
        case solver_parameters::constraint_order::lagrangian_decr:
        case solver_parameters::constraint_order::lagrangian_incr:
        default:
            compute_violated_constraints(s, x, R);
            break;
        }
    }